

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prival.c
# Opt level: O0

char * stumpless_get_prival_string(int prival)

{
  stumpless_severity severity_00;
  stumpless_facility facility_00;
  char *__s;
  char *__s_00;
  size_t __n;
  size_t __n_00;
  char *__dest;
  size_t len_facility;
  size_t len_severity;
  char *prival_string;
  size_t prival_string_size;
  char *facility;
  char *severity;
  int prival_local;
  
  severity_00 = get_severity(prival);
  __s = stumpless_get_severity_string(severity_00);
  facility_00 = get_facility(prival);
  __s_00 = stumpless_get_facility_string(facility_00);
  __n = strlen(__s);
  __n_00 = strlen(__s_00);
  __dest = (char *)alloc_mem(__n + __n_00 + 4);
  memcpy(__dest,__s,__n);
  (__dest + __n)[0] = ' ';
  (__dest + __n)[1] = '|';
  __dest[__n + 2] = ' ';
  memcpy(__dest + __n + 3,__s_00,__n_00);
  __dest[__n_00 + __n + 3] = '\0';
  return __dest;
}

Assistant:

const char *
stumpless_get_prival_string( int prival ) {
  const char *severity;
  const char *facility;
  size_t prival_string_size;
  char *prival_string;

  severity = stumpless_get_severity_string( get_severity( prival ) );
  facility = stumpless_get_facility_string( get_facility( prival ) );
   
  size_t len_severity = strlen(severity); // to not call strlen() mutiples times, unsure about impact
  size_t len_facility = strlen(facility);

  // +3 for formatting, +1 for termination
  prival_string_size = ( len_severity + len_facility + 4);
  prival_string = alloc_mem( prival_string_size );
  
  memcpy( prival_string, severity , len_severity); 
  memcpy( prival_string + len_severity, " | ", 3); // 3 is the size of " | "
  memcpy( prival_string + len_severity + 3, facility, len_facility);
  memcpy( prival_string + len_severity + 3 + len_facility, "\0", 1);
  
  return prival_string;
}